

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.h
# Opt level: O2

void __thiscall HighsSimplexAnalysis::HighsSimplexAnalysis(HighsSimplexAnalysis *this)

{
  undefined8 *puVar1;
  long lVar2;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  
  *(undefined8 *)((long)&this->pointer_serial_factor_clocks + 4) = 0;
  this->numCol = 0;
  this->numTot = 0;
  (this->thread_factor_clocks).super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pointer_serial_factor_clocks = (HighsTimerClock *)0x0;
  (this->thread_factor_clocks).super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_factor_clocks).super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_simplex_clocks).
  super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_simplex_clocks).
  super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->timer_ = (HighsTimer *)0x0;
  (this->thread_simplex_clocks).
  super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->model_name_,"",&local_29);
  std::__cxx11::string::string((string *)&this->lp_name_,"",&local_2a);
  *(undefined8 *)((long)&(this->log_options).user_callback._M_invoker + 1) = 0;
  *(undefined8 *)((long)&(this->log_options).user_callback_data + 1) = 0;
  (this->log_options).user_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->log_options).user_callback._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->log_options).user_callback.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->log_options).user_callback.super__Function_base._M_functor + 8) = 0;
  (this->log_options).user_log_callback = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
  (this->log_options).user_log_callback_data = (void *)0x0;
  (this->log_options).log_to_console = (bool *)0x0;
  (this->log_options).log_dev_level = (HighsInt *)0x0;
  (this->log_options).log_stream = (FILE *)0x0;
  (this->log_options).output_flag = (bool *)0x0;
  this->simplex_strategy = 0;
  this->edge_weight_mode = kSteepestEdge;
  this->analyse_lp_data = false;
  this->analyse_simplex_summary_data = false;
  this->analyse_simplex_runtime_data = false;
  this->analyse_simplex_time = false;
  this->analyse_simplex_time = false;
  this->analyse_factor_data = false;
  this->analyse_factor_time = false;
  this->analyse_simplex_data = false;
  this->solve_phase = 0;
  this->simplex_iteration_count = 0;
  this->devex_iteration_count = 0;
  this->pivotal_row_index = 0;
  this->pivotal_row_index = 0;
  this->leaving_variable = 0;
  this->entering_variable = 0;
  this->rebuild_reason = 0;
  std::__cxx11::string::string((string *)&this->rebuild_reason_string,"",&local_2b);
  *(undefined8 *)((long)&this->sum_primal_infeasibility + 4) = 0;
  *(undefined8 *)((long)&this->sum_dual_infeasibility + 4) = 0;
  this->num_primal_infeasibility = 0;
  this->num_dual_infeasibility = 0;
  this->sum_primal_infeasibility = 0.0;
  this->numerical_trouble = 0.0;
  this->objective_value = 0.0;
  this->pivot_value_from_row = 0.0;
  this->factor_pivot_threshold = 0.0;
  this->dual_step = 0.0;
  this->pivot_value_from_column = 0.0;
  this->primal_delta = 0.0;
  this->primal_step = 0.0;
  this->edge_weight = 0.0;
  this->edge_weight_error = 0.0;
  this->reduced_rhs_value = 0.0;
  this->reduced_cost_value = 0.0;
  this->num_devex_framework = 0;
  this->max_dual_phase_1_lp_dual_infeasibility = 0.0;
  this->sum_dual_phase_1_lp_dual_infeasibility = 0.0;
  this->col_aq_density = 0.0;
  this->row_ep_density = 0.0;
  this->row_ap_density = 0.0;
  this->row_DSE_density = 0.0;
  this->col_steepest_edge_density = 0.0;
  this->col_basic_feasibility_change_density = 0.0;
  this->row_basic_feasibility_change_density = 0.0;
  this->col_BFRT_density = 0.0;
  this->num_costly_DSE_iteration = 0;
  this->primal_col_density = 0.0;
  this->dual_col_density = 0.0;
  this->costly_DSE_measure = 0.0;
  this->multi_iteration_count = 0;
  this->multi_chosen = 0;
  this->multi_finished = 0;
  this->min_concurrency = 0;
  this->num_concurrency = 0;
  this->max_concurrency = 0;
  this->max_concurrency = 0;
  this->num_col_price = 0;
  this->num_row_price = 0;
  this->num_row_price_with_switch = 0;
  (this->before_ftran_upper_sparse_density).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->before_ftran_upper_sparse_density).distribution_name_.field_2;
  (this->before_ftran_upper_sparse_density).distribution_name_._M_string_length = 0;
  (this->before_ftran_upper_sparse_density).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->before_ftran_upper_sparse_density).value_name_._M_dataplus._M_p =
       (pointer)&(this->before_ftran_upper_sparse_density).value_name_.field_2;
  (this->before_ftran_upper_sparse_density).value_name_._M_string_length = 0;
  (this->before_ftran_upper_sparse_density).value_name_.field_2._M_local_buf[0] = '\0';
  (this->before_ftran_upper_sparse_density).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->before_ftran_upper_sparse_density).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->before_ftran_upper_sparse_density).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->before_ftran_upper_sparse_density).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->before_ftran_upper_sparse_density).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->before_ftran_upper_sparse_density).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ftran_upper_sparse_density).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->ftran_upper_sparse_density).distribution_name_.field_2;
  (this->ftran_upper_sparse_density).distribution_name_._M_string_length = 0;
  (this->ftran_upper_sparse_density).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->ftran_upper_sparse_density).value_name_._M_dataplus._M_p =
       (pointer)&(this->ftran_upper_sparse_density).value_name_.field_2;
  (this->ftran_upper_sparse_density).value_name_._M_string_length = 0;
  (this->ftran_upper_sparse_density).value_name_.field_2._M_local_buf[0] = '\0';
  (this->ftran_upper_sparse_density).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ftran_upper_sparse_density).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ftran_upper_sparse_density).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ftran_upper_sparse_density).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ftran_upper_sparse_density).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ftran_upper_sparse_density).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->before_ftran_upper_hyper_density).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->before_ftran_upper_hyper_density).distribution_name_.field_2;
  (this->before_ftran_upper_hyper_density).distribution_name_._M_string_length = 0;
  (this->before_ftran_upper_hyper_density).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->before_ftran_upper_hyper_density).value_name_._M_dataplus._M_p =
       (pointer)&(this->before_ftran_upper_hyper_density).value_name_.field_2;
  (this->before_ftran_upper_hyper_density).value_name_._M_string_length = 0;
  (this->before_ftran_upper_hyper_density).value_name_.field_2._M_local_buf[0] = '\0';
  (this->before_ftran_upper_hyper_density).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->before_ftran_upper_hyper_density).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->before_ftran_upper_hyper_density).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->before_ftran_upper_hyper_density).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->before_ftran_upper_hyper_density).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->before_ftran_upper_hyper_density).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->ftran_upper_hyper_density).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->ftran_upper_hyper_density).distribution_name_.field_2;
  (this->ftran_upper_hyper_density).distribution_name_._M_string_length = 0;
  (this->ftran_upper_hyper_density).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->ftran_upper_hyper_density).value_name_._M_dataplus._M_p =
       (pointer)&(this->ftran_upper_hyper_density).value_name_.field_2;
  (this->ftran_upper_hyper_density).value_name_._M_string_length = 0;
  (this->ftran_upper_hyper_density).value_name_.field_2._M_local_buf[0] = '\0';
  (this->ftran_upper_hyper_density).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ftran_upper_hyper_density).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ftran_upper_hyper_density).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ftran_upper_hyper_density).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ftran_upper_hyper_density).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ftran_upper_hyper_density).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cost_perturbation1_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->cost_perturbation1_distribution).distribution_name_.field_2;
  (this->cost_perturbation1_distribution).distribution_name_._M_string_length = 0;
  (this->cost_perturbation1_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->cost_perturbation1_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->cost_perturbation1_distribution).value_name_.field_2;
  (this->cost_perturbation1_distribution).value_name_._M_string_length = 0;
  (this->cost_perturbation1_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->cost_perturbation1_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cost_perturbation1_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cost_perturbation1_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cost_perturbation1_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cost_perturbation1_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cost_perturbation1_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cost_perturbation2_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->cost_perturbation2_distribution).distribution_name_.field_2;
  (this->cost_perturbation2_distribution).distribution_name_._M_string_length = 0;
  (this->cost_perturbation2_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->cost_perturbation2_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->cost_perturbation2_distribution).value_name_.field_2;
  (this->cost_perturbation2_distribution).value_name_._M_string_length = 0;
  (this->cost_perturbation2_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->cost_perturbation2_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cost_perturbation2_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cost_perturbation2_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cost_perturbation2_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cost_perturbation2_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cost_perturbation2_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cleanup_dual_change_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_dual_change_distribution).distribution_name_.field_2;
  (this->cleanup_dual_change_distribution).distribution_name_._M_string_length = 0;
  (this->cleanup_dual_change_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_dual_change_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_dual_change_distribution).value_name_.field_2;
  (this->cleanup_dual_change_distribution).value_name_._M_string_length = 0;
  (this->cleanup_dual_change_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_dual_change_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cleanup_dual_change_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cleanup_dual_change_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cleanup_dual_change_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cleanup_dual_change_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->cleanup_dual_change_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->cleanup_primal_step_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_primal_step_distribution).distribution_name_.field_2;
  (this->cleanup_primal_step_distribution).distribution_name_._M_string_length = 0;
  (this->cleanup_primal_step_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_primal_step_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_primal_step_distribution).value_name_.field_2;
  (this->cleanup_primal_step_distribution).value_name_._M_string_length = 0;
  (this->cleanup_primal_step_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_primal_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cleanup_primal_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cleanup_primal_step_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cleanup_primal_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cleanup_primal_step_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->cleanup_primal_step_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->cleanup_dual_step_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_dual_step_distribution).distribution_name_.field_2;
  (this->cleanup_dual_step_distribution).distribution_name_._M_string_length = 0;
  (this->cleanup_dual_step_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_dual_step_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_dual_step_distribution).value_name_.field_2;
  (this->cleanup_dual_step_distribution).value_name_._M_string_length = 0;
  (this->cleanup_dual_step_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_dual_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cleanup_dual_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cleanup_dual_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cleanup_dual_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cleanup_dual_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cleanup_dual_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cleanup_primal_change_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_primal_change_distribution).distribution_name_.field_2;
  (this->cleanup_primal_change_distribution).distribution_name_._M_string_length = 0;
  (this->cleanup_primal_change_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_primal_change_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->cleanup_primal_change_distribution).value_name_.field_2;
  (this->cleanup_primal_change_distribution).value_name_._M_string_length = 0;
  (this->cleanup_primal_change_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->cleanup_primal_change_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cleanup_primal_change_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cleanup_primal_change_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cleanup_primal_change_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cleanup_primal_change_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->cleanup_primal_change_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  this->max_quad_chuzc_size = 0;
  this->max_heap_chuzc_size = 0;
  this->num_improve_choose_column_row_call = 0;
  this->num_remove_pivot_from_pack = 0;
  this->num_correct_dual_primal_flip = 0;
  this->sum_quad_chuzc_size = 0.0;
  this->sum_heap_chuzc_size = 0.0;
  this->num_primal_cycling_detections = 0;
  this->num_dual_cycling_detections = 0;
  this->num_quad_chuzc = 0;
  this->num_heap_chuzc = 0;
  this->min_correct_dual_primal_flip_dual_infeasibility = INFINITY;
  this->max_correct_dual_primal_flip = 0.0;
  this->num_correct_dual_cost_shift = 0;
  memset(&this->max_correct_dual_cost_shift_dual_infeasibility,0,0x108);
  this->num_invert_report_since_last_header = -1;
  this->num_iteration_report_since_last_header = -1;
  *(undefined4 *)&this->highs_run_time = 0;
  *(undefined4 *)((long)&this->highs_run_time + 4) = 0;
  *(undefined4 *)&this->last_user_log_time = 0;
  *(undefined4 *)((long)&this->last_user_log_time + 4) = 0xfff00000;
  this->delta_user_log_time = 1.0;
  this->timeless_log = false;
  this->average_concurrency = 0.0;
  this->average_fraction_of_possible_minor_iterations_performed = 0.0;
  this->num_major_kernel = 0;
  this->sum_multi_chosen = 0;
  this->sum_multi_finished = 0;
  this->num_invert = 0;
  this->num_kernel = 0;
  this->max_kernel_dim = 0.0;
  this->sum_kernel_dim = 0.0;
  this->running_average_kernel_dim = 0.0;
  this->sum_invert_fill_factor = 0.0;
  this->sum_kernel_fill_factor = 0.0;
  this->sum_major_kernel_fill_factor = 0.0;
  this->running_average_invert_fill_factor = 1.0;
  this->running_average_kernel_fill_factor = 1.0;
  this->running_average_major_kernel_fill_factor = 1.0;
  memset(&this->AnIterIt0,0,0x918);
  lVar2 = 0;
  do {
    *(char **)((long)&this->AnIterOp[0].AnIterOpName._M_dataplus._M_p + lVar2) =
         this->AnIterOp[0].AnIterOpName.field_2._M_local_buf + lVar2;
    *(undefined8 *)((long)&this->AnIterOp[0].AnIterOpName._M_string_length + lVar2) = 0;
    this->AnIterOp[0].AnIterOpName.field_2._M_local_buf[lVar2] = '\0';
    *(char **)((long)&this->AnIterOp[0].AnIterOp_density.distribution_name_._M_dataplus._M_p + lVar2
              ) = this->AnIterOp[0].AnIterOp_density.distribution_name_.field_2._M_local_buf + lVar2
    ;
    *(undefined8 *)
     ((long)&this->AnIterOp[0].AnIterOp_density.distribution_name_._M_string_length + lVar2) = 0;
    this->AnIterOp[0].AnIterOp_density.distribution_name_.field_2._M_local_buf[lVar2] = '\0';
    *(char **)((long)&this->AnIterOp[0].AnIterOp_density.value_name_._M_dataplus._M_p + lVar2) =
         this->AnIterOp[0].AnIterOp_density.value_name_.field_2._M_local_buf + lVar2;
    *(undefined8 *)((long)&this->AnIterOp[0].AnIterOp_density.value_name_._M_string_length + lVar2)
         = 0;
    this->AnIterOp[0].AnIterOp_density.value_name_.field_2._M_local_buf[lVar2] = '\0';
    puVar1 = (undefined8 *)
             ((long)&this->AnIterOp[0].AnIterOp_density.limit_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->AnIterOp[0].AnIterOp_density.limit_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)&this->AnIterOp[0].AnIterOp_density.count_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0xe8;
  } while (lVar2 != 0x910);
  memset(&this->AnIterTraceNumRec,0,0xa94);
  (this->primal_step_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->primal_step_distribution).distribution_name_.field_2;
  (this->primal_step_distribution).distribution_name_._M_string_length = 0;
  (this->primal_step_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->primal_step_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->primal_step_distribution).value_name_.field_2;
  (this->primal_step_distribution).value_name_._M_string_length = 0;
  (this->primal_step_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->primal_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->primal_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->primal_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->primal_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->primal_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->primal_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dual_step_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->dual_step_distribution).distribution_name_.field_2;
  (this->dual_step_distribution).distribution_name_._M_string_length = 0;
  (this->dual_step_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->dual_step_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->dual_step_distribution).value_name_.field_2;
  (this->dual_step_distribution).value_name_._M_string_length = 0;
  (this->dual_step_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->dual_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dual_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dual_step_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dual_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dual_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dual_step_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_pivot_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->simplex_pivot_distribution).distribution_name_.field_2;
  (this->simplex_pivot_distribution).distribution_name_._M_string_length = 0;
  (this->simplex_pivot_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->simplex_pivot_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->simplex_pivot_distribution).value_name_.field_2;
  (this->simplex_pivot_distribution).value_name_._M_string_length = 0;
  (this->simplex_pivot_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->simplex_pivot_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_pivot_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_pivot_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->simplex_pivot_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->simplex_pivot_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->simplex_pivot_distribution).count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->numerical_trouble_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->numerical_trouble_distribution).distribution_name_.field_2;
  (this->numerical_trouble_distribution).distribution_name_._M_string_length = 0;
  (this->numerical_trouble_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->numerical_trouble_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->numerical_trouble_distribution).value_name_.field_2;
  (this->numerical_trouble_distribution).value_name_._M_string_length = 0;
  (this->numerical_trouble_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->numerical_trouble_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->numerical_trouble_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->numerical_trouble_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->numerical_trouble_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->numerical_trouble_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->numerical_trouble_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->factor_pivot_threshold_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->factor_pivot_threshold_distribution).distribution_name_.field_2;
  (this->factor_pivot_threshold_distribution).distribution_name_._M_string_length = 0;
  (this->factor_pivot_threshold_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->factor_pivot_threshold_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->factor_pivot_threshold_distribution).value_name_.field_2;
  (this->factor_pivot_threshold_distribution).value_name_._M_string_length = 0;
  (this->factor_pivot_threshold_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->factor_pivot_threshold_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->factor_pivot_threshold_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->factor_pivot_threshold_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->factor_pivot_threshold_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->factor_pivot_threshold_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->factor_pivot_threshold_distribution).limit_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->edge_weight_error_distribution).distribution_name_._M_dataplus._M_p =
       (pointer)&(this->edge_weight_error_distribution).distribution_name_.field_2;
  (this->edge_weight_error_distribution).distribution_name_._M_string_length = 0;
  (this->edge_weight_error_distribution).distribution_name_.field_2._M_local_buf[0] = '\0';
  (this->edge_weight_error_distribution).value_name_._M_dataplus._M_p =
       (pointer)&(this->edge_weight_error_distribution).value_name_.field_2;
  (this->edge_weight_error_distribution).value_name_._M_string_length = 0;
  (this->edge_weight_error_distribution).value_name_.field_2._M_local_buf[0] = '\0';
  (this->edge_weight_error_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edge_weight_error_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edge_weight_error_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edge_weight_error_distribution).count_.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edge_weight_error_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edge_weight_error_distribution).limit_.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

HighsSimplexAnalysis()
      : timer_(nullptr),
        pointer_serial_factor_clocks(nullptr),
        numRow(0),
        numCol(0),
        numTot(0),
        model_name_(""),
        lp_name_(""),
        analyse_lp_data(false),
        analyse_simplex_summary_data(false),
        analyse_simplex_runtime_data(false),
        analyse_simplex_time(false),
        analyse_factor_data(false),
        analyse_factor_time(false),
        analyse_simplex_data(false),
        simplex_strategy(0),
        edge_weight_mode(EdgeWeightMode::kSteepestEdge),
        solve_phase(0),
        simplex_iteration_count(0),
        devex_iteration_count(0),
        pivotal_row_index(0),
        leaving_variable(0),
        entering_variable(0),
        rebuild_reason(0),
        rebuild_reason_string(""),
        reduced_rhs_value(0.0),
        reduced_cost_value(0.0),
        edge_weight(0.0),
        edge_weight_error(0.0),
        primal_delta(0.0),
        primal_step(0.0),
        dual_step(0.0),
        pivot_value_from_column(0.0),
        pivot_value_from_row(0.0),
        factor_pivot_threshold(0.0),
        numerical_trouble(0.0),
        objective_value(0.0),
        num_primal_infeasibility(0),
        num_dual_infeasibility(0),
        sum_primal_infeasibility(0.0),
        sum_dual_infeasibility(0.0),
        num_dual_phase_1_lp_dual_infeasibility(0),
        max_dual_phase_1_lp_dual_infeasibility(0.0),
        sum_dual_phase_1_lp_dual_infeasibility(0.0),
        num_devex_framework(0),
        col_aq_density(0.0),
        row_ep_density(0.0),
        row_ap_density(0.0),
        row_DSE_density(0.0),
        col_steepest_edge_density(0.0),
        col_basic_feasibility_change_density(0.0),
        row_basic_feasibility_change_density(0.0),
        col_BFRT_density(0.0),
        primal_col_density(0.0),
        dual_col_density(0.0),
        num_costly_DSE_iteration(0),
        costly_DSE_measure(0.0),
        multi_iteration_count(0),
        multi_chosen(0),
        multi_finished(0),
        min_concurrency(0),
        num_concurrency(0),
        max_concurrency(0),
        num_col_price(0),
        num_row_price(0),
        num_row_price_with_switch(0),
        num_primal_cycling_detections(0),
        num_dual_cycling_detections(0),
        num_quad_chuzc(0),
        num_heap_chuzc(0),
        sum_quad_chuzc_size(0.0),
        sum_heap_chuzc_size(0.0),
        max_quad_chuzc_size(0),
        max_heap_chuzc_size(0),
        num_improve_choose_column_row_call(0),
        num_remove_pivot_from_pack(0),
        num_correct_dual_primal_flip(0),
        min_correct_dual_primal_flip_dual_infeasibility(kHighsInf),
        max_correct_dual_primal_flip(0.0),
        num_correct_dual_cost_shift(0),
        max_correct_dual_cost_shift_dual_infeasibility(0.0),
        max_correct_dual_cost_shift(0.0),
        net_num_single_cost_shift(0),
        num_single_cost_shift(0),
        max_single_cost_shift(0.0),
        sum_single_cost_shift(0.0),
        num_dual_steepest_edge_weight_check(0),
        num_dual_steepest_edge_weight_reject(0),
        num_wrong_low_dual_steepest_edge_weight(0),
        num_wrong_high_dual_steepest_edge_weight(0),
        average_frequency_low_dual_steepest_edge_weight(0.0),
        average_frequency_high_dual_steepest_edge_weight(0.0),
        average_log_low_dual_steepest_edge_weight_error(0.0),
        average_log_high_dual_steepest_edge_weight_error(0.0),
        max_average_frequency_low_dual_steepest_edge_weight(0.0),
        max_average_frequency_high_dual_steepest_edge_weight(0.0),
        max_sum_average_frequency_extreme_dual_steepest_edge_weight(0.0),
        max_average_log_low_dual_steepest_edge_weight_error(0.0),
        max_average_log_high_dual_steepest_edge_weight_error(0.0),
        max_sum_average_log_extreme_dual_steepest_edge_weight_error(0.0),
        num_invert_report_since_last_header(-1),
        num_iteration_report_since_last_header(-1),
        highs_run_time(0.0),
        last_user_log_time(-kHighsInf),
        delta_user_log_time(1e0),
        timeless_log(false),
        average_concurrency(0.0),
        average_fraction_of_possible_minor_iterations_performed(0.0),
        sum_multi_chosen(0),
        sum_multi_finished(0),
        num_invert(0),
        num_kernel(0),
        num_major_kernel(0),
        max_kernel_dim(0.0),
        sum_kernel_dim(0.0),
        running_average_kernel_dim(0.0),
        sum_invert_fill_factor(0.0),
        sum_kernel_fill_factor(0.0),
        sum_major_kernel_fill_factor(0.0),
        running_average_invert_fill_factor(1.0),
        running_average_kernel_fill_factor(1.0),
        running_average_major_kernel_fill_factor(1.0),
        AnIterIt0(0),
        AnIterPrevIt(0),
        AnIterOp{},
        AnIterTraceNumRec(0),
        AnIterTraceIterDl(0),
        AnIterTrace{},
        AnIterNumInvert{},
        AnIterNumEdWtIt{} {}